

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.cc
# Opt level: O0

void * __thiscall rcg::Buffer::getBase(Buffer *this,uint32_t part)

{
  unsigned_long uVar1;
  undefined4 in_ESI;
  shared_ptr<const_rcg::GenTLWrapper> *in_RDI;
  size_t offset;
  void *ret;
  undefined8 in_stack_ffffffffffffffc8;
  BUFFER_INFO_CMD cmd;
  void *in_stack_ffffffffffffffd8;
  shared_ptr<const_rcg::GenTLWrapper> *in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe8;
  shared_ptr<const_rcg::GenTLWrapper> *local_8;
  
  if (((ulong)in_RDI[2].super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi & 1) == 0) {
    Stream::getHandle((Stream *)
                      (in_RDI->
                      super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>).
                      _M_ptr);
    cmd = (BUFFER_INFO_CMD)((ulong)in_stack_ffffffffffffffc8 >> 0x20);
    local_8 = (shared_ptr<const_rcg::GenTLWrapper> *)
              (anonymous_namespace)::getBufferValue<void*>
                        (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_RDI,cmd);
    Stream::getHandle((Stream *)
                      (in_RDI->
                      super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>).
                      _M_ptr);
    uVar1 = anon_unknown_5::getBufferValue<unsigned_long>
                      (local_8,in_stack_ffffffffffffffd8,in_RDI,cmd);
    if (uVar1 != 0) {
      local_8 = (shared_ptr<const_rcg::GenTLWrapper> *)
                ((long)&(local_8->
                        super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>).
                        _M_ptr + uVar1);
    }
  }
  else {
    Stream::getHandle((Stream *)
                      (in_RDI->
                      super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>).
                      _M_ptr);
    local_8 = (shared_ptr<const_rcg::GenTLWrapper> *)
              (anonymous_namespace)::getBufferPartValue<void*>
                        (in_RDI,(void *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),
                         in_stack_ffffffffffffffe0,
                         (uint32_t)((ulong)in_stack_ffffffffffffffd8 >> 0x20),
                         (BUFFER_PART_INFO_CMD)in_stack_ffffffffffffffd8);
  }
  return local_8;
}

Assistant:

void *Buffer::getBase(uint32_t part) const
{
  if (multipart)
  {
    return getBufferPartValue<void *>(gentl, parent->getHandle(), buffer, part,
                                      GenTL::BUFFER_PART_INFO_BASE);
  }
  else
  {
    void *ret=getBufferValue<void *>(gentl, parent->getHandle(), buffer, GenTL::BUFFER_INFO_BASE);

    size_t offset=getBufferValue<size_t>(gentl, parent->getHandle(), buffer,
                                         GenTL::BUFFER_INFO_IMAGEOFFSET);

    if (offset > 0)
    {
      ret=reinterpret_cast<char *>(ret)+offset;
    }

    return ret;
  }
}